

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O1

bool __thiscall S2LatLngRect::Contains(S2LatLngRect *this,S2LatLng *ll)

{
  double dVar1;
  bool bVar2;
  S2LogMessage SStack_28;
  
  if ((1.5707963267948966 < ABS((ll->coords_).c_[0])) ||
     (3.141592653589793 < ABS((ll->coords_).c_[1]))) {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x8f,kError,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Invalid S2LatLng in S2LatLngRect::Contains: ",0x2c);
    ::operator<<(SStack_28.stream_,ll);
    S2LogMessage::~S2LogMessage(&SStack_28);
  }
  dVar1 = (ll->coords_).c_[0];
  bVar2 = false;
  if (((this->lat_).bounds_.c_[0] <= dVar1) && (bVar2 = false, dVar1 <= (this->lat_).bounds_.c_[1]))
  {
    bVar2 = S1Interval::Contains(&this->lng_,(ll->coords_).c_[1]);
  }
  return bVar2;
}

Assistant:

bool S2LatLngRect::Contains(const S2LatLng& ll) const {
  S2_DLOG_IF(ERROR, !ll.is_valid())
      << "Invalid S2LatLng in S2LatLngRect::Contains: " << ll;

  return (lat_.Contains(ll.lat().radians()) &&
          lng_.Contains(ll.lng().radians()));
}